

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall dg::vr::StructureAnalyzer::categorizeEdges(StructureAnalyzer *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this_00;
  VRLocation *in_RDI;
  VRLocation *successor;
  VREdge *succEdge;
  uint i;
  VREdge *predEdge;
  VRLocation *current;
  SimpleDFS it;
  Function *function;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  VRLocation *in_stack_ffffffffffffff00;
  VRCodeGraph *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar4;
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *in_stack_ffffffffffffff50;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_18;
  undefined8 local_10;
  
  local_10 = *(undefined8 *)in_RDI;
  local_18.NodePtr =
       (node_pointer)
       llvm::Module::begin((Module *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_20.NodePtr =
       (node_pointer)
       llvm::Module::end((Module *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while (bVar1 = llvm::operator!=(&local_18,&local_20), bVar1) {
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                 *)0x1ee2cc);
    uVar3 = llvm::GlobalValue::isDeclaration();
    if ((uVar3 & 1) == 0) {
      VRCodeGraph::dfs_begin(in_stack_ffffffffffffff08,(Function *)in_stack_ffffffffffffff00);
      while( true ) {
        VRCodeGraph::dfs_end();
        bVar1 = vr::operator!=((DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                               (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        in_stack_fffffffffffffef4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::~DFSIt
                  ((DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        if ((in_stack_fffffffffffffef4 & 0x1000000) == 0) break;
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator*
                  ((DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)0x1ee35b);
        this_00 = (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)
                  VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::getEdge
                            ((DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)0x1ee36d);
        if (this_00 != (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)0x0) {
          *(EdgeType *)
           &(this_00->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left = TREE;
        }
        in_stack_fffffffffffffef0 = 0;
        while (uVar4 = in_stack_fffffffffffffef0,
              uVar2 = VRLocation::succsSize((VRLocation *)0x1ee3a0),
              in_stack_fffffffffffffef0 < uVar2) {
          in_stack_ffffffffffffff08 =
               (VRCodeGraph *)
               VRLocation::getSuccEdge
                         ((VRLocation *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffeec);
          in_stack_ffffffffffffff00 =
               *(VRLocation **)&(in_stack_ffffffffffffff08->locations).field_0x8;
          if (in_stack_ffffffffffffff00 == (VRLocation *)0x0) {
            *(EdgeType *)&in_stack_ffffffffffffff08->functionMapping = TREE;
          }
          else {
            bVar1 = VRCodeGraph::SimpleVisit::wasVisited
                              ((SimpleVisit *)in_stack_ffffffffffffff00,in_RDI);
            if (bVar1) {
              bVar1 = VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::onStack
                                (this_00,(VRLocation *)CONCAT44(uVar4,in_stack_ffffffffffffff10));
              if (bVar1) {
                *(EdgeType *)&in_stack_ffffffffffffff08->functionMapping = BACK;
              }
              else {
                *(EdgeType *)&in_stack_ffffffffffffff08->functionMapping = FORWARD;
              }
            }
          }
          in_stack_fffffffffffffef0 = uVar4 + 1;
        }
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator++(in_stack_ffffffffffffff50);
      }
      VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::~DFSIt
                ((DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  VRCodeGraph::hasCategorizedEdges((VRCodeGraph *)(in_RDI->relations).graph.reported);
  return;
}

Assistant:

void StructureAnalyzer::categorizeEdges() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.dfs_begin(function); it != codeGraph.dfs_end();
             ++it) {
            VRLocation &current = *it;
            VREdge *predEdge = it.getEdge();

            if (predEdge)
                predEdge->type = EdgeType::TREE;

            for (unsigned i = 0; i < current.succsSize(); ++i) {
                VREdge *succEdge = current.getSuccEdge(i);
                VRLocation *successor = succEdge->target;

                if (!successor)
                    succEdge->type = EdgeType::TREE;
                else if (it.wasVisited(successor)) {
                    if (it.onStack(successor))
                        succEdge->type = EdgeType::BACK;
                    else
                        succEdge->type = EdgeType::FORWARD;
                }
            }
        }
    }

    codeGraph.hasCategorizedEdges();
}